

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O0

bool __thiscall myutils::SharedSemaphore::post(SharedSemaphore *this)

{
  int iVar1;
  SharedSemaphore *this_local;
  
  iVar1 = sem_post((sem_t *)this->m_sem);
  return iVar1 == 0;
}

Assistant:

bool SharedSemaphore::post()
{
#ifdef _WIN32
    if (m_hSemaphore) {
        ReleaseSemaphore(m_hSemaphore, 1, NULL);
        return true;
    } else {
        return false;
    }
#elif defined(__linux__)
    return sem_post(m_sem) == 0;
#else
    if (m_data) {
        pthread_mutex_lock(&m_data->mtx);
        m_data->count++;
        //cout << "post " << m_data->count << endl;
        pthread_cond_signal(&m_data->cond);
        pthread_mutex_unlock(&m_data->mtx);
        return true;
    } else {
        return false;
    }
#endif
}